

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

void xmlRelaxNGValidateCompiledCallback
               (xmlRegExecCtxtPtr exec,xmlChar *token,void *transdata,void *inputdata)

{
  int iVar1;
  xmlRelaxNGValidCtxtPtr ctxt;
  xmlRelaxNGDefinePtr_conflict define;
  char *__format;
  
  if (inputdata == (void *)0x0) {
    fprintf(_stderr,"callback on %s missing context\n",token);
    return;
  }
  if (transdata == (void *)0x0) {
    if (*token == '#') {
      return;
    }
    __format = "callback on %s missing define\n";
  }
  else {
    if (*transdata == 4) {
      iVar1 = xmlRelaxNGValidateDefinition
                        ((xmlRelaxNGValidCtxtPtr)inputdata,(xmlRelaxNGDefinePtr_conflict)transdata);
      if (iVar1 == 0) {
        return;
      }
      *(int *)((long)inputdata + 0xb8) = iVar1;
      return;
    }
    __format = "callback on %s define is not element\n";
  }
  fprintf(_stderr,__format,token);
  if (*(int *)((long)inputdata + 0x44) == 0) {
    *(undefined4 *)((long)inputdata + 0x44) = 0x25;
  }
  return;
}

Assistant:

static void
xmlRelaxNGValidateCompiledCallback(xmlRegExecCtxtPtr exec ATTRIBUTE_UNUSED,
                                   const xmlChar * token,
                                   void *transdata, void *inputdata)
{
    xmlRelaxNGValidCtxtPtr ctxt = (xmlRelaxNGValidCtxtPtr) inputdata;
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) transdata;
    int ret;

#ifdef DEBUG_COMPILE
    xmlGenericError(xmlGenericErrorContext,
                    "Compiled callback for: '%s'\n", token);
#endif
    if (ctxt == NULL) {
        fprintf(stderr, "callback on %s missing context\n", token);
        return;
    }
    if (define == NULL) {
        if (token[0] == '#')
            return;
        fprintf(stderr, "callback on %s missing define\n", token);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    }
    if ((ctxt == NULL) || (define == NULL)) {
        fprintf(stderr, "callback on %s missing info\n", token);
        if ((ctxt != NULL) && (ctxt->errNo == XML_RELAXNG_OK))
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    } else if (define->type != XML_RELAXNG_ELEMENT) {
        fprintf(stderr, "callback on %s define is not element\n", token);
        if (ctxt->errNo == XML_RELAXNG_OK)
            ctxt->errNo = XML_RELAXNG_ERR_INTERNAL;
        return;
    }
    ret = xmlRelaxNGValidateDefinition(ctxt, define);
    if (ret != 0)
        ctxt->perr = ret;
}